

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::AggregateInitialiserList::AggregateInitialiserList
          (AggregateInitialiserList *this,CodeLocation *l,Type *t)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  CodeLocation local_20;
  
  local_20.sourceCode.object = (l->sourceCode).object;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  local_20.location.data = (l->location).data;
  Expression::Expression(&this->super_Expression,&local_20);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_20.sourceCode.object);
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__AggregateInitialiserList_002da2b8;
  CVar2 = t->arrayElementCategory;
  bVar3 = t->isRef;
  bVar4 = t->isConstant;
  (this->type).category = t->category;
  (this->type).arrayElementCategory = CVar2;
  (this->type).isRef = bVar3;
  (this->type).isConstant = bVar4;
  (this->type).primitiveType.type = (t->primitiveType).type;
  BVar5 = t->arrayElementBoundingSize;
  (this->type).boundingSize = t->boundingSize;
  (this->type).arrayElementBoundingSize = BVar5;
  pSVar1 = (t->structure).object;
  (this->type).structure.object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->items).items = (pool_ref<soul::heart::Expression> *)(this->items).space;
  (this->items).numActive = 0;
  (this->items).numAllocated = 4;
  return;
}

Assistant:

AggregateInitialiserList (CodeLocation l, const Type& t) : Expression (std::move (l)), type (t) {}